

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

ssize_t __thiscall
Assimp::CFIReaderImpl::read(CFIReaderImpl *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  byte *pbVar2;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  string *extraout_RAX_02;
  string *psVar3;
  DeadlyImportError *this_00;
  shared_ptr<const_Assimp::FIValue> chars;
  
  if (this->headerPending == true) {
    this->headerPending = false;
    parseHeader(this);
  }
  if (this->terminatorPending == true) {
    this->terminatorPending = false;
LAB_005474fd:
    if ((this->elementStack).c.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        (this->elementStack).c.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      return 0;
    }
    std::__cxx11::string::_M_assign((string *)&this->nodeName);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back(&(this->elementStack).c);
    psVar3 = (string *)0x0;
    this->currentNodeType = (uint)((this->nodeName)._M_string_length == 0) * 4 + EXN_ELEMENT_END;
    goto LAB_00547708;
  }
  pbVar2 = this->dataP;
  if (this->dataEnd <= pbVar2) {
    return 0;
  }
  bVar1 = *pbVar2;
  if (-1 < (char)bVar1) {
    parseElement(this);
    psVar3 = extraout_RAX;
    goto LAB_00547708;
  }
  if (bVar1 < 0xc0) {
    parseNonIdentifyingStringOrIndex3
              ((CFIReaderImpl *)&chars,
               (vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
                *)this);
    (**(chars.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       _vptr_FIValue)();
    std::__cxx11::string::_M_assign((string *)&this->nodeName);
    this->currentNodeType = EXN_TEXT;
LAB_005475c3:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&chars.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    psVar3 = extraout_RAX_00;
  }
  else {
    if (bVar1 < 0xe0) {
      if ((bVar1 & 0xfc) == 200) {
        this->dataP = pbVar2 + 1;
        psVar3 = parseIdentifyingStringOrIndex(this,&(this->vocabulary).otherNCNameTable);
        if ((bVar1 & 2) != 0) {
          psVar3 = parseIdentifyingStringOrIndex(this,&(this->vocabulary).otherURITable);
        }
        if ((bVar1 & 1) != 0) {
          psVar3 = parseIdentifyingStringOrIndex(this,&(this->vocabulary).otherURITable);
        }
      }
      else {
        if ((bVar1 & 0xfc) != 0xc4) {
LAB_0054775a:
          this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          DeadlyImportError::DeadlyImportError(this_00,(string *)parseErrorMessage_abi_cxx11_);
LAB_005477ac:
          __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        this->dataP = pbVar2 + 1;
        if ((bVar1 & 2) != 0) {
          parseIdentifyingStringOrIndex(this,&(this->vocabulary).otherURITable);
        }
        if ((bVar1 & 1) != 0) {
          parseIdentifyingStringOrIndex(this,&(this->vocabulary).otherURITable);
        }
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&(this->elementStack).c,(value_type *)&EmptyString_abi_cxx11_);
        psVar3 = extraout_RAX_01;
      }
    }
    else {
      if (0xef < bVar1) {
        this->dataP = pbVar2 + 1;
        if (bVar1 == 0xff) {
          this->terminatorPending = true;
        }
        goto LAB_005474fd;
      }
      if (bVar1 == 0xe2) {
        this->dataP = pbVar2 + 1;
        if ((long)this->dataEnd - (long)(pbVar2 + 1) < 1) {
          this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          DeadlyImportError::DeadlyImportError(this_00,(string *)parseErrorMessage_abi_cxx11_);
          goto LAB_005477ac;
        }
        parseNonIdentifyingStringOrIndex1
                  ((CFIReaderImpl *)&chars,
                   (vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
                    *)this);
        (**(chars.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           _vptr_FIValue)();
        std::__cxx11::string::_M_assign((string *)&this->nodeName);
        this->currentNodeType = EXN_COMMENT;
        goto LAB_005475c3;
      }
      if (bVar1 != 0xe1) goto LAB_0054775a;
      this->dataP = pbVar2 + 1;
      parseIdentifyingStringOrIndex(this,&(this->vocabulary).otherNCNameTable);
      if (this->dataEnd == this->dataP || (long)this->dataEnd - (long)this->dataP < 0) {
        this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        DeadlyImportError::DeadlyImportError(this_00,(string *)parseErrorMessage_abi_cxx11_);
        goto LAB_005477ac;
      }
      parseNonIdentifyingStringOrIndex1
                ((CFIReaderImpl *)&stack0xffffffffffffffd8,
                 (vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
                  *)this);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
      psVar3 = extraout_RAX_02;
    }
    this->currentNodeType = EXN_UNKNOWN;
  }
LAB_00547708:
  return CONCAT71((int7)((ulong)psVar3 >> 8),1);
}

Assistant:

virtual bool read() /*override*/ {
        if (headerPending) {
            headerPending = false;
            parseHeader();
        }
        if (terminatorPending) {
            terminatorPending = false;
            if (elementStack.empty()) {
                return false;
            }
            else {
                nodeName = elementStack.top();
                elementStack.pop();
                currentNodeType = nodeName.empty() ? irr::io::EXN_UNKNOWN : irr::io::EXN_ELEMENT_END;
                return true;
            }
        }
        if (dataP >= dataEnd) {
            return false;
        }
        uint8_t b = *dataP;
        if (b < 0x80) { // Element (C.2.11.2, C.3.7.2)
            // C.3
            parseElement();
            return true;
        }
        else if (b < 0xc0) { // Characters (C.3.7.5)
            // C.7
            auto chars = parseNonIdentifyingStringOrIndex3(vocabulary.charactersTable);
            nodeName = chars->toString();
            currentNodeType = irr::io::EXN_TEXT;
            return true;
        }
        else if (b < 0xe0) {
            if ((b & 0xfc) == 0xc4) { // DTD (C.2.11.5)
                // C.9
                ++dataP;
                if (b & 0x02) {
                    /*const std::string &systemID =*/ parseIdentifyingStringOrIndex(vocabulary.otherURITable);
                }
                if (b & 0x01) {
                    /*const std::string &publicID =*/ parseIdentifyingStringOrIndex(vocabulary.otherURITable);
                }
                elementStack.push(EmptyString);
                currentNodeType = irr::io::EXN_UNKNOWN;
                return true;
            }
            else if ((b & 0xfc) == 0xc8) { // Unexpanded entity reference (C.3.7.4)
                // C.6
                ++dataP;
                /*const std::string &name =*/ parseIdentifyingStringOrIndex(vocabulary.otherNCNameTable);
                if (b & 0x02) {
                    /*const std::string &systemID =*/ parseIdentifyingStringOrIndex(vocabulary.otherURITable);
                }
                if (b & 0x01) {
                    /*const std::string &publicID =*/ parseIdentifyingStringOrIndex(vocabulary.otherURITable);
                }
                currentNodeType = irr::io::EXN_UNKNOWN;
                return true;
            }
        }
        else if (b < 0xf0) {
            if (b == 0xe1) { // Processing instruction (C.2.11.3, C.3.7.3)
                // C.5
                ++dataP;
                /*const std::string &target =*/ parseIdentifyingStringOrIndex(vocabulary.otherNCNameTable);
                if (dataEnd - dataP < 1) {
                    throw DeadlyImportError(parseErrorMessage);
                }
                /*std::shared_ptr<const FIValue> data =*/ parseNonIdentifyingStringOrIndex1(vocabulary.otherStringTable);
                currentNodeType = irr::io::EXN_UNKNOWN;
                return true;
            }
            else if (b == 0xe2) { // Comment (C.2.11.4, C.3.7.6)
                // C.8
                ++dataP;
                if (dataEnd - dataP < 1) {
                    throw DeadlyImportError(parseErrorMessage);
                }
                std::shared_ptr<const FIValue> comment = parseNonIdentifyingStringOrIndex1(vocabulary.otherStringTable);
                nodeName = comment->toString();
                currentNodeType = irr::io::EXN_COMMENT;
                return true;
            }
        }
        else { // Terminator (C.2.12, C.3.8)
            ++dataP;
            if (b == 0xff) {
                terminatorPending = true;
            }
            if (elementStack.empty()) {
                return false;
            }
            else {
                nodeName = elementStack.top();
                elementStack.pop();
                currentNodeType = nodeName.empty() ? irr::io::EXN_UNKNOWN : irr::io::EXN_ELEMENT_END;
                return true;
            }
        }
        throw DeadlyImportError(parseErrorMessage);
    }